

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<char,_false>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<char,false,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  internal_node<char,_false> *p_node;
  byte bVar1;
  internal_node<char,_false> *piVar2;
  rrb_size_table<false> *prVar3;
  undefined4 *__ptr;
  uint32_t uVar4;
  ulong uVar5;
  char *__function;
  undefined4 in_register_00000084;
  long lVar6;
  tree_node<char,_false> *ptVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ref<immutable::rrb_details::tree_node<char,_false>_> right_hand_node;
  ref<immutable::rrb_details::tree_node<char,_false>_> internal_root_child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_78;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_70;
  tree_node<char,_false> *local_68;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_60;
  uint32_t *local_58;
  undefined8 local_50;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_48;
  size_t local_40;
  rrb_size_table<false> *local_38;
  
  local_50 = CONCAT44(in_register_00000084,shift);
  bVar1 = (byte)shift & 0x1f;
  uVar9 = right >> bVar1;
  p_node = (internal_node<char,_false> *)root->ptr;
  if (shift != 0) {
    if (p_node == (internal_node<char,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
      ;
LAB_0014303c:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,__function);
    }
    p_node->_ref_count = p_node->_ref_count + 1;
    prVar3 = (p_node->size_table).ptr;
    local_68 = (tree_node<char,_false> *)this;
    if (prVar3 == (rrb_size_table<false> *)0x0) {
      uVar8 = (ulong)uVar9;
      local_70.ptr = (tree_node<char,_false> *)p_node->child[uVar8].ptr;
      if ((internal_node<char,_false> *)local_70.ptr != (internal_node<char,_false> *)0x0) {
        ((internal_node<char,_false> *)local_70.ptr)->_ref_count =
             ((internal_node<char,_false> *)local_70.ptr)->_ref_count + 1;
      }
      local_58 = total_shift;
      rrb_drop_right_rec<char,false,5>
                ((rrb_details *)&local_78,total_shift,&local_70,
                 right - (uVar9 << ((byte)shift & 0x1f)),shift - 5,right >> bVar1 != 0 || has_left);
      if (right >> bVar1 != 0) {
        uVar9 = uVar9 + 1;
        piVar2 = (internal_node<char,_false> *)malloc((ulong)uVar9 * 8 + 0x20);
        piVar2->len = uVar9;
        piVar2->type = INTERNAL_NODE;
        (piVar2->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar2->guid = 0;
        piVar2->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar2 + 1);
        lVar6 = 0;
        memset(piVar2 + 1,0,(ulong)uVar9 * 8);
        ptVar7 = local_68;
        piVar2->_ref_count = 1;
        do {
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                     ((long)&piVar2->child->ptr + lVar6),
                     (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                     ((long)&p_node->child->ptr + lVar6));
          lVar6 = lVar6 + 8;
        } while (uVar8 * 8 != lVar6);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar2->child + uVar8)
                   ,&local_78);
        *local_58 = (uint32_t)local_50;
        *(internal_node<char,_false> **)ptVar7 = piVar2;
        piVar2->_ref_count = piVar2->_ref_count + 1;
        release<char>(piVar2);
        goto LAB_00142ffb;
      }
      if (has_left) {
        piVar2 = (internal_node<char,_false> *)malloc(0x28);
        piVar2->type = INTERNAL_NODE;
        piVar2->len = 1;
        (piVar2->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar2->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar2 + 1);
        piVar2[1].type = LEAF_NODE;
        piVar2[1].len = 0;
        piVar2->_ref_count = 1;
        piVar2->guid = 0;
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar2 + 1),&local_78)
        ;
        ptVar7 = local_68;
        *local_58 = (uint32_t)local_50;
        *(internal_node<char,_false> **)local_68 = piVar2;
        piVar2->_ref_count = piVar2->_ref_count + 1;
        release<char>(piVar2);
        goto LAB_00142ffb;
      }
    }
    else {
      uVar8 = (ulong)(uVar9 - 1);
      do {
        uVar5 = uVar8;
        iVar10 = (int)uVar5;
        uVar9 = iVar10 + 1;
        uVar8 = (ulong)uVar9;
      } while (prVar3->size[uVar8] <= right);
      uVar4 = right;
      if (uVar9 != 0) {
        uVar4 = right - prVar3->size[uVar5];
      }
      local_70.ptr = (tree_node<char,_false> *)p_node->child[uVar8].ptr;
      if ((internal_node<char,_false> *)local_70.ptr != (internal_node<char,_false> *)0x0) {
        ((internal_node<char,_false> *)local_70.ptr)->_ref_count =
             ((internal_node<char,_false> *)local_70.ptr)->_ref_count + 1;
      }
      local_38 = prVar3;
      rrb_drop_right_rec<char,false,5>
                ((rrb_details *)&local_78,total_shift,&local_70,uVar4,shift - 5,
                 uVar9 != 0 || has_left);
      if (uVar9 != 0) {
        uVar9 = iVar10 + 2;
        uVar5 = (ulong)uVar9;
        local_40 = uVar5 * 8;
        local_58 = total_shift;
        piVar2 = (internal_node<char,_false> *)malloc(uVar5 * 8 + 0x20);
        piVar2->len = uVar9;
        piVar2->type = INTERNAL_NODE;
        local_48 = &piVar2->size_table;
        (piVar2->size_table).ptr = (rrb_size_table<false> *)0x0;
        lVar6 = 0;
        piVar2->guid = 0;
        piVar2->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar2 + 1);
        memset(piVar2 + 1,0,local_40);
        piVar2->_ref_count = 1;
        prVar3 = (rrb_size_table<false> *)malloc(uVar5 * 4 + 0x10);
        prVar3->size = (uint32_t *)(prVar3 + 1);
        prVar3->guid = 0;
        prVar3->_ref_count = 1;
        local_60.ptr = prVar3;
        memcpy(prVar3 + 1,local_38->size,uVar8 * 4);
        *(uint32_t *)((long)&prVar3[1].size + uVar8 * 4) = right + 1;
        do {
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                     ((long)&piVar2->child->ptr + lVar6),
                     (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                     ((long)&p_node->child->ptr + lVar6));
          lVar6 = lVar6 + 8;
        } while (uVar8 << 3 != lVar6);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(local_48,&local_60);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar2->child + uVar8)
                   ,&local_78);
        ptVar7 = local_68;
        *local_58 = (uint32_t)local_50;
        piVar2->_ref_count = piVar2->_ref_count + 1;
        *(internal_node<char,_false> **)local_68 = piVar2;
        if ((local_60.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar4 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar4 - 1, uVar4 == 1))
        {
          free(local_60.ptr);
        }
        release<char>(piVar2);
        goto LAB_00142ffb;
      }
      if (has_left) {
        piVar2 = (internal_node<char,_false> *)malloc(0x28);
        piVar2->type = INTERNAL_NODE;
        piVar2->len = 1;
        (piVar2->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar2->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar2 + 1);
        piVar2[1].type = LEAF_NODE;
        piVar2[1].len = 0;
        piVar2->_ref_count = 1;
        piVar2->guid = 0;
        local_60.ptr = (rrb_size_table<false> *)malloc(0x14);
        (local_60.ptr)->size = (uint32_t *)(local_60.ptr + 1);
        (local_60.ptr)->guid = 0;
        (local_60.ptr)->_ref_count = 1;
        *(uint32_t *)&local_60.ptr[1].size = right + 1;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar2->size_table,&local_60);
        ptVar7 = local_68;
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar2->child,&local_78
                  );
        *total_shift = (uint32_t)local_50;
        piVar2->_ref_count = piVar2->_ref_count + 1;
        *(internal_node<char,_false> **)ptVar7 = piVar2;
        if ((local_60.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar4 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar4 - 1, uVar4 == 1))
        {
          free(local_60.ptr);
        }
        release<char>(piVar2);
        goto LAB_00142ffb;
      }
    }
    *(tree_node<char,_false> **)local_68 = local_78.ptr;
    ptVar7 = local_68;
    if (local_78.ptr != (tree_node<char,_false> *)0x0) {
      (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
    }
LAB_00142ffb:
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_78);
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_70);
    release<char>(p_node);
    return (ref<immutable::rrb_details::tree_node<char,_false>_>)ptVar7;
  }
  if (p_node != (internal_node<char,_false> *)0x0) {
    p_node->_ref_count = p_node->_ref_count + 1;
  }
  uVar8 = (ulong)(uVar9 + 1);
  __ptr = (undefined4 *)malloc(uVar8 + 0x18);
  __ptr[1] = uVar9 + 1;
  *__ptr = 0;
  *(undefined4 **)(__ptr + 4) = __ptr + 6;
  __ptr[3] = 0;
  if (uVar9 + 1 == 0) {
    __ptr[2] = 1;
  }
  else {
    uVar5 = 0;
    do {
      *(undefined1 *)(*(long *)(__ptr + 4) + uVar5) = 0;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
    __ptr[2] = 1;
    if (uVar8 != 0) {
      if (p_node == (internal_node<char,_false> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
        ;
        goto LAB_0014303c;
      }
      uVar5 = 0;
      do {
        *(undefined1 *)(*(long *)(__ptr + 4) + uVar5) =
             *(undefined1 *)((long)&((p_node->size_table).ptr)->size + uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      iVar10 = __ptr[2];
      *total_shift = 0;
      *(undefined4 **)this = __ptr;
      if (iVar10 == 0) {
        free(__ptr);
      }
      goto LAB_00142ea2;
    }
  }
  *total_shift = 0;
  *(undefined4 **)this = __ptr;
  if (p_node == (internal_node<char,_false> *)0x0) {
    return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
  }
LAB_00142ea2:
  uVar4 = p_node->_ref_count;
  p_node->_ref_count = uVar4 - 1;
  if (uVar4 == 1) {
    free(p_node);
  }
  return (ref<immutable::rrb_details::tree_node<char,_false>_>)(tree_node<char,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }